

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::Promise<void>,capnp::LocalClient::BlockedCall>::
AdapterPromiseNode<capnp::LocalClient&,unsigned_long_const&,unsigned_short_const&,capnp::CallContextHook&>
          (AdapterPromiseNode<kj::Promise<void>,capnp::LocalClient::BlockedCall> *this,
          LocalClient *params,unsigned_long *params_1,unsigned_short *params_2,
          CallContextHook *params_3)

{
  uint16_t methodId;
  uint64_t interfaceId;
  LocalClient *client;
  unsigned_long *puVar1;
  unsigned_short *puVar2;
  CallContextHook *context;
  CallContextHook *params_local_3;
  unsigned_short *params_local_2;
  unsigned_long *params_local_1;
  LocalClient *params_local;
  AdapterPromiseNode<kj::Promise<void>,_capnp::LocalClient::BlockedCall> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<kj::Promise<void>_>::PromiseFulfiller
            ((PromiseFulfiller<kj::Promise<void>_> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00d89a18;
  *(undefined ***)(this + 0x18) = &PTR_reject_00d89a68;
  ExceptionOr<kj::Promise<void>_>::ExceptionOr((ExceptionOr<kj::Promise<void>_> *)(this + 0x20));
  this[0x1c8] = (AdapterPromiseNode<kj::Promise<void>,capnp::LocalClient::BlockedCall>)0x1;
  client = fwd<capnp::LocalClient&>(params);
  puVar1 = fwd<unsigned_long_const&>(params_1);
  interfaceId = *puVar1;
  puVar2 = fwd<unsigned_short_const&>(params_2);
  methodId = *puVar2;
  context = fwd<capnp::CallContextHook&>(params_3);
  ::capnp::LocalClient::BlockedCall::BlockedCall
            ((BlockedCall *)(this + 0x1d0),(PromiseFulfiller<kj::Promise<void>_> *)(this + 0x18),
             client,interfaceId,methodId,context);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}